

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDI;
  char *in_R8;
  char *in_R9;
  
  iVar1 = strcmp(in_R8,"0.11.0");
  if ((iVar1 == 0) && (iVar1 = strncmp(in_R9,"cv-gm*uh",8), iVar1 == 0)) {
    sexp_define_foreign_aux
              (in_RDI,in_RCX,"%make-parameter",2,0,"sexp_make_parameter",sexp_make_parameter,0);
    sexp_define_foreign_aux
              (in_RDI,in_RCX,"parameter-converter",1,0,"sexp_parameter_converter",
               sexp_parameter_converter,0);
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;

  sexp_define_foreign(ctx, env, "%make-parameter", 2, sexp_make_parameter);
  sexp_define_foreign(ctx, env, "parameter-converter", 1, sexp_parameter_converter);

  return SEXP_VOID;
}